

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# switch_descriptorset_pass.cpp
# Opt level: O0

Status __thiscall spvtools::opt::SwitchDescriptorSetPass::Process(SwitchDescriptorSetPass *this)

{
  Instruction *this_00;
  initializer_list<unsigned_int> init_list;
  bool bVar1;
  Op OVar2;
  uint32_t uVar3;
  IRContext *this_01;
  DecorationManager *this_02;
  uint32_t local_cc;
  iterator local_c8;
  undefined8 local_c0;
  SmallVector<unsigned_int,_2UL> local_b8;
  uint32_t local_8c;
  reference ppIStack_88;
  Decoration d;
  Instruction **deco;
  iterator __end3;
  iterator __begin3;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *__range3;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> decos;
  Instruction *var;
  iterator __end2;
  iterator __begin2;
  IteratorRange<spvtools::opt::InstructionList::iterator> *__range2;
  DecorationManager *deco_mgr;
  Status status;
  SwitchDescriptorSetPass *this_local;
  
  deco_mgr._4_4_ = SuccessWithoutChange;
  this_01 = Pass::context(&this->super_Pass);
  this_02 = IRContext::get_decoration_mgr(this_01);
  Pass::context(&this->super_Pass);
  IRContext::types_values((IRContext *)&__begin2);
  IteratorRange<spvtools::opt::InstructionList::iterator>::begin
            ((IteratorRange<spvtools::opt::InstructionList::iterator> *)&__end2);
  IteratorRange<spvtools::opt::InstructionList::iterator>::end
            ((IteratorRange<spvtools::opt::InstructionList::iterator> *)&var);
  do {
    bVar1 = utils::operator!=(&__end2.super_iterator,
                              (iterator_template<spvtools::opt::Instruction> *)&var);
    if (!bVar1) {
      return deco_mgr._4_4_;
    }
    decos.
    super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)utils::IntrusiveList<spvtools::opt::Instruction>::
                  iterator_template<spvtools::opt::Instruction>::operator*(&__end2.super_iterator);
    OVar2 = opt::Instruction::opcode
                      ((Instruction *)
                       decos.
                       super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (OVar2 == OpVariable) {
      uVar3 = opt::Instruction::result_id
                        ((Instruction *)
                         decos.
                         super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
      analysis::DecorationManager::GetDecorationsFor
                ((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                  *)&__range3,this_02,uVar3,false);
      __end3 = std::
               vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
               begin((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                      *)&__range3);
      deco = (Instruction **)
             std::
             vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
             end((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                  *)&__range3);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
                                         *)&deco), bVar1) {
        ppIStack_88 = __gnu_cxx::
                      __normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
                      ::operator*(&__end3);
        local_8c = opt::Instruction::GetSingleWordInOperand(*ppIStack_88,1);
        if ((local_8c == 0x22) &&
           (uVar3 = opt::Instruction::GetSingleWordInOperand(*ppIStack_88,2),
           uVar3 == *(uint32_t *)&(this->super_Pass).field_0x34)) {
          this_00 = *ppIStack_88;
          local_cc = this->ds_to_;
          local_c8 = &local_cc;
          local_c0 = 1;
          init_list._M_len = 1;
          init_list._M_array = local_c8;
          utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_b8,init_list);
          opt::Instruction::SetInOperand(this_00,2,&local_b8);
          utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_b8);
          deco_mgr._4_4_ = SuccessWithChange;
          break;
        }
        __gnu_cxx::
        __normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
        ::operator++(&__end3);
      }
      std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
      ~vector((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *
              )&__range3);
    }
    InstructionList::iterator::operator++(&__end2);
  } while( true );
}

Assistant:

Pass::Status SwitchDescriptorSetPass::Process() {
  Status status = Status::SuccessWithoutChange;
  auto* deco_mgr = context()->get_decoration_mgr();

  for (Instruction& var : context()->types_values()) {
    if (var.opcode() != spv::Op::OpVariable) {
      continue;
    }
    auto decos = deco_mgr->GetDecorationsFor(var.result_id(), false);
    for (const auto& deco : decos) {
      spv::Decoration d = spv::Decoration(deco->GetSingleWordInOperand(1u));
      if (d == spv::Decoration::DescriptorSet &&
          deco->GetSingleWordInOperand(2u) == ds_from_) {
        deco->SetInOperand(2u, {ds_to_});
        status = Status::SuccessWithChange;
        break;
      }
    }
  }
  return status;
}